

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# refine_peaks.cpp
# Opt level: O0

void trt_pose::parse::refine_peaks_out_hw
               (float *refined_peaks,int *counts,int *peaks,float *cmap,int H,int W,int M,
               int window_size)

{
  float fVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  float *pfVar8;
  float weight;
  int jj_idx;
  int jj;
  int ii_idx;
  int ii;
  float weight_sum;
  int j;
  int i;
  int *peak;
  float *refined_peak;
  int m;
  int win;
  int count;
  int W_local;
  int H_local;
  float *cmap_local;
  int *peaks_local;
  int *counts_local;
  float *refined_peaks_local;
  
  iVar2 = *counts;
  iVar5 = window_size / 2;
  for (refined_peak._4_4_ = 0; refined_peak._4_4_ < iVar2;
      refined_peak._4_4_ = refined_peak._4_4_ + 1) {
    pfVar8 = refined_peaks + (refined_peak._4_4_ << 1);
    *pfVar8 = 0.0;
    pfVar8[1] = 0.0;
    iVar3 = peaks[refined_peak._4_4_ << 1];
    iVar4 = (peaks + (refined_peak._4_4_ << 1))[1];
    ii_idx = 0;
    for (jj = iVar3 - iVar5; jj < iVar3 + iVar5 + 1; jj = jj + 1) {
      iVar6 = reflect(jj,0,H);
      for (weight = (float)(iVar4 - iVar5); (int)weight < iVar4 + iVar5 + 1;
          weight = (float)((int)weight + 1)) {
        iVar7 = reflect((int)weight,0,W);
        fVar1 = cmap[iVar6 * W + iVar7];
        *pfVar8 = fVar1 * (float)jj + *pfVar8;
        pfVar8[1] = fVar1 * (float)(int)weight + pfVar8[1];
        ii_idx = (int)(fVar1 + (float)ii_idx);
      }
    }
    *pfVar8 = *pfVar8 / (float)ii_idx;
    pfVar8[1] = pfVar8[1] / (float)ii_idx;
    *pfVar8 = *pfVar8 + 0.5;
    pfVar8[1] = pfVar8[1] + 0.5;
    *pfVar8 = *pfVar8 / (float)H;
    pfVar8[1] = pfVar8[1] / (float)W;
  }
  return;
}

Assistant:

void refine_peaks_out_hw(float *refined_peaks, // Mx2
                         const int *counts,    // 1
                         const int *peaks,     // Mx2
                         const float *cmap,    // HxW
                         const int H, const int W, const int M,
                         const int window_size) {
  int count = *counts;
  int win = window_size / 2;

  for (int m = 0; m < count; m++) {
    float *refined_peak = &refined_peaks[m * 2];
    refined_peak[0] = 0.;
    refined_peak[1] = 0.;
    const int *peak = &peaks[m * 2];

    int i = peak[0];
    int j = peak[1];
    float weight_sum = 0.;

    for (int ii = i - win; ii < i + win + 1; ii++) {
      int ii_idx = reflect(ii, 0, H);
      for (int jj = j - win; jj < j + win + 1; jj++) {
        int jj_idx = reflect(jj, 0, W);

        float weight = cmap[ii_idx * W + jj_idx];
        refined_peak[0] += weight * ii;
        refined_peak[1] += weight * jj;
        weight_sum += weight;
      }
    }

    refined_peak[0] /= weight_sum;
    refined_peak[1] /= weight_sum;
    refined_peak[0] += 0.5; // center pixel
    refined_peak[1] += 0.5; // center pixel
    refined_peak[0] /= H;   // normalize coordinates
    refined_peak[1] /= W;   // normalize coordinates
  }
}